

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O2

void __thiscall
QVncClientCursor::changeCursor(QVncClientCursor *this,QCursor *widgetCursor,QWindow *window)

{
  QVncClient **ppQVar1;
  long lVar2;
  int iVar3;
  QPoint QVar4;
  long lVar5;
  long in_FS_OFFSET;
  QPlatformCursorImage local_68;
  QPixmap local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((widgetCursor == (QCursor *)0x0) || (iVar3 = QCursor::shape(), iVar3 != 0x18)) {
    local_68._16_8_ = 0xaaaaaaaaaaaaaaaa;
    local_68.hot.xp.m_i = -0x55555556;
    local_68.hot.yp.m_i = -0x55555556;
    local_68.cursorImage = (QImage)0xaa;
    local_68._1_7_ = 0xaaaaaaaaaaaaaa;
    local_68._8_8_ = 0xaaaaaaaaaaaaaaaa;
    QPlatformCursorImage::QPlatformCursorImage(&local_68,(uchar *)0x0,(uchar *)0x0,0,0,0,0);
    QPlatformCursorImage::set((CursorShape)&local_68);
    QImage::operator=(&this->cursor,(QImage *)&local_68);
    this->hotspot = local_68.hot;
    QImage::~QImage(&local_68.cursorImage);
  }
  else {
    QVar4 = (QPoint)QCursor::hotSpot();
    this->hotspot = QVar4;
    QCursor::pixmap();
    QPixmap::toImage();
    QImage::operator=(&this->cursor,&local_68.cursorImage);
    QImage::~QImage(&local_68.cursorImage);
    QPixmap::~QPixmap(local_40);
  }
  ppQVar1 = (this->clients).d.ptr;
  lVar2 = (this->clients).d.size;
  for (lVar5 = 0; lVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
    QVncClient::setDirtyCursor(*(QVncClient **)((long)ppQVar1 + lVar5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVncClientCursor::changeCursor(QCursor *widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        hotspot = widgetCursor->hotSpot();
        cursor = widgetCursor->pixmap().toImage();
    } else {
        // system cursor
        QPlatformCursorImage platformImage(nullptr, nullptr, 0, 0, 0, 0);
        platformImage.set(shape);
        cursor = *platformImage.image();
        hotspot = platformImage.hotspot();
    }
    for (auto client : std::as_const(clients))
        client->setDirtyCursor();
}